

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int save_xattrs(archive_write *a,file_conflict *file)

{
  int iVar1;
  int iVar2;
  wchar_t local_4c;
  int r;
  int count;
  size_t size;
  heap_data *heap;
  void *value;
  char *name;
  xar_conflict *xar;
  file_conflict *file_local;
  archive_write *a_local;
  
  name = (char *)a->format_data;
  xar = (xar_conflict *)file;
  file_local = (file_conflict *)a;
  local_4c = archive_entry_xattr_reset(file->entry);
  if (local_4c == L'\0') {
    a_local._4_4_ = 0;
  }
  else {
    do {
      while( true ) {
        if (local_4c == L'\0') {
          return 0;
        }
        archive_entry_xattr_next
                  ((archive_entry *)xar->cur_dirent,(char **)&value,&heap,(size_t *)&r);
        checksum_init((chksumwork_conflict *)(name + 0x98),*(sumalg *)(name + 0x84));
        checksum_init((chksumwork_conflict *)(name + 0xb0),*(sumalg *)(name + 0x84));
        size = (size_t)calloc(1,0x80);
        if ((int *)size == (int *)0x0) {
          archive_set_error((archive *)file_local,0xc,"Can\'t allocate memory for xattr");
          return -0x1e;
        }
        iVar1 = *(int *)&(xar->e_sumwrk).md5ctx;
        *(int *)&(xar->e_sumwrk).md5ctx = iVar1 + 1;
        *(int *)size = iVar1;
        *(undefined8 *)(size + 0x10) = *(undefined8 *)(name + 8);
        *(size_t *)(size + 0x20) = _r;
        *(int *)(size + 0x28) = *(int *)(name + 0x88);
        checksum_update((chksumwork_conflict *)(name + 0xb0),heap,_r);
        checksum_final((chksumwork_conflict *)(name + 0xb0),(chksumval_conflict *)(size + 0x58));
        if (*(int *)(size + 0x28) != 0) break;
        checksum_update((chksumwork_conflict *)(name + 0x98),heap,_r);
        checksum_final((chksumwork_conflict *)(name + 0x98),(chksumval_conflict *)(size + 0x30));
        iVar1 = write_to_temp((archive_write *)file_local,heap,_r);
        if (iVar1 != 0) {
          free((void *)size);
          return -0x1e;
        }
        *(size_t *)(size + 0x18) = _r;
        *(undefined8 *)(size + 8) = 0;
        *(size_t *)(xar->stream).next_in = size;
        (xar->stream).next_in = (uchar *)(size + 8);
        local_4c = local_4c + L'\xffffffff';
      }
      iVar1 = xar_compression_init_encoder((archive_write *)file_local);
      if (iVar1 != 0) {
        free((void *)size);
        return -0x1e;
      }
      *(heap_data **)(name + 200) = heap;
      *(size_t *)(name + 0xd0) = _r;
      while( true ) {
        iVar1 = compression_code((archive *)file_local,(la_zstream_conflict *)(name + 200),
                                 ARCHIVE_Z_FINISH);
        if ((iVar1 != 0) && (iVar1 != 1)) {
          free((void *)size);
          return -0x1e;
        }
        _r = 0x10000 - *(long *)(name + 0xe8);
        checksum_update((chksumwork_conflict *)(name + 0x98),name + 0x120,_r);
        iVar2 = write_to_temp((archive_write *)file_local,name + 0x120,_r);
        if (iVar2 != 0) {
          free((void *)size);
          return -0x1e;
        }
        if (iVar1 != 0) break;
        *(char **)(name + 0xe0) = name + 0x120;
        name[0xe8] = '\0';
        name[0xe9] = '\0';
        name[0xea] = '\x01';
        name[0xeb] = '\0';
        name[0xec] = '\0';
        name[0xed] = '\0';
        name[0xee] = '\0';
        name[0xef] = '\0';
      }
      checksum_final((chksumwork_conflict *)(name + 0x98),(chksumval_conflict *)(size + 0x30));
      *(undefined8 *)(size + 0x18) = *(undefined8 *)(name + 0xf0);
      *(undefined8 *)(size + 8) = 0;
      *(size_t *)(xar->stream).next_in = size;
      (xar->stream).next_in = (uchar *)(size + 8);
      iVar1 = compression_end((archive *)file_local,(la_zstream_conflict *)(name + 200));
      local_4c = local_4c + L'\xffffffff';
    } while (iVar1 == 0);
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
save_xattrs(struct archive_write *a, struct file *file)
{
	struct xar *xar;
	const char *name;
	const void *value;
	struct heap_data *heap;
	size_t size;
	int count, r;

	xar = (struct xar *)a->format_data;
	count = archive_entry_xattr_reset(file->entry);
	if (count == 0)
		return (ARCHIVE_OK);
	while (count--) {
		archive_entry_xattr_next(file->entry,
		    &name, &value, &size);
		checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
		checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);

		heap = calloc(1, sizeof(*heap));
		if (heap == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for xattr");
			return (ARCHIVE_FATAL);
		}
		heap->id = file->ea_idx++;
		heap->temp_offset = xar->temp_offset;
		heap->size = size;/* save a extracted size */
		heap->compression = xar->opt_compression;
		/* Get a extracted sumcheck value. */
		checksum_update(&(xar->e_sumwrk), value, size);
		checksum_final(&(xar->e_sumwrk), &(heap->e_sum));

		/*
		 * Not compression to xattr is simple way.
		 */
		if (heap->compression == NONE) {
			checksum_update(&(xar->a_sumwrk), value, size);
			checksum_final(&(xar->a_sumwrk), &(heap->a_sum));
			if (write_to_temp(a, value, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			heap->length = size;
			/* Add heap to the tail of file->xattr. */
			heap->next = NULL;
			*file->xattr.last = heap;
			file->xattr.last = &(heap->next);
			/* Next xattr */
			continue;
		}

		/*
		 * Init compression library.
		 */
		r = xar_compression_init_encoder(a);
		if (r != ARCHIVE_OK) {
			free(heap);
			return (ARCHIVE_FATAL);
		}

		xar->stream.next_in = (const unsigned char *)value;
		xar->stream.avail_in = size;
		for (;;) {
			r = compression_code(&(a->archive),
			    &(xar->stream), ARCHIVE_Z_FINISH);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			size = sizeof(xar->wbuff) - xar->stream.avail_out;
			checksum_update(&(xar->a_sumwrk),
			    xar->wbuff, size);
			if (write_to_temp(a, xar->wbuff, size)
			    != ARCHIVE_OK) {
				free(heap);
				return (ARCHIVE_FATAL);
			}
			if (r == ARCHIVE_OK) {
				xar->stream.next_out = xar->wbuff;
				xar->stream.avail_out = sizeof(xar->wbuff);
			} else {
				checksum_final(&(xar->a_sumwrk),
				    &(heap->a_sum));
				heap->length = xar->stream.total_out;
				/* Add heap to the tail of file->xattr. */
				heap->next = NULL;
				*file->xattr.last = heap;
				file->xattr.last = &(heap->next);
				break;
			}
		}
		/* Clean up compression library. */
		r = compression_end(&(a->archive), &(xar->stream));
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}